

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O1

int channel_mix_2_0_to_4_0(mixed_segment *segment)

{
  float fVar1;
  float fVar2;
  undefined8 *puVar3;
  ulong uVar4;
  uint32_t frames;
  float *rr;
  float *rl;
  float *fr;
  float *fl;
  float *r;
  float *l;
  uint32_t local_44;
  float *local_40;
  float *local_38;
  float *local_30;
  float *local_28;
  float *local_20;
  float *local_18;
  
  puVar3 = (undefined8 *)segment->data;
  local_44 = 0xffffffff;
  mixed_buffer_request_read(&local_18,&local_44,(mixed_buffer *)*puVar3);
  mixed_buffer_request_read(&local_20,&local_44,(mixed_buffer *)puVar3[1]);
  mixed_buffer_request_write(&local_28,&local_44,(mixed_buffer *)puVar3[0xe]);
  mixed_buffer_request_write(&local_30,&local_44,(mixed_buffer *)puVar3[0xf]);
  mixed_buffer_request_write(&local_38,&local_44,(mixed_buffer *)puVar3[0x10]);
  mixed_buffer_request_write(&local_40,&local_44,(mixed_buffer *)puVar3[0x11]);
  if ((ulong)local_44 != 0) {
    uVar4 = 0;
    do {
      fVar1 = local_18[uVar4];
      fVar2 = local_20[uVar4];
      local_28[uVar4] = fVar1;
      local_30[uVar4] = fVar2;
      local_38[uVar4] = fVar1;
      local_40[uVar4] = fVar2;
      uVar4 = uVar4 + 1;
    } while (local_44 != uVar4);
  }
  mixed_buffer_finish_read(local_44,(mixed_buffer *)*puVar3);
  mixed_buffer_finish_read(local_44,(mixed_buffer *)puVar3[1]);
  mixed_buffer_finish_write(local_44,(mixed_buffer *)puVar3[0xe]);
  mixed_buffer_finish_write(local_44,(mixed_buffer *)puVar3[0xf]);
  mixed_buffer_finish_write(local_44,(mixed_buffer *)puVar3[0x10]);
  mixed_buffer_finish_write(local_44,(mixed_buffer *)puVar3[0x11]);
  return 1;
}

Assistant:

VECTORIZE int channel_mix_2_0_to_4_0(struct mixed_segment *segment){
  struct channel_data *data = (struct channel_data *)segment->data;
  
  uint32_t frames = UINT32_MAX;
  float *restrict l, *restrict r, *restrict fl, *restrict fr, *restrict rl, *restrict rr;
  mixed_buffer_request_read(&l, &frames, data->in[MIXED_LEFT]);
  mixed_buffer_request_read(&r, &frames, data->in[MIXED_RIGHT]);
  mixed_buffer_request_write(&fl, &frames, data->out[MIXED_LEFT_FRONT]);
  mixed_buffer_request_write(&fr, &frames, data->out[MIXED_RIGHT_FRONT]);
  mixed_buffer_request_write(&rl, &frames, data->out[MIXED_LEFT_REAR]);
  mixed_buffer_request_write(&rr, &frames, data->out[MIXED_RIGHT_REAR]);
  for(uint32_t i=0; i<frames; ++i){
    float li = l[i];
    float ri = r[i];

    fl[i] = li;
    fr[i] = ri;
    rl[i] = li;
    rr[i] = ri;
  }
  mixed_buffer_finish_read(frames, data->in[MIXED_LEFT]);
  mixed_buffer_finish_read(frames, data->in[MIXED_RIGHT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_LEFT_FRONT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_RIGHT_FRONT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_LEFT_REAR]);
  mixed_buffer_finish_write(frames, data->out[MIXED_RIGHT_REAR]);

  return 1;
}